

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::BasicWriter<char>::write_int<int,fmt::FormatSpec>
          (BasicWriter<char> *this,int value,FormatSpec spec)

{
  char code;
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  CharPtr pcVar4;
  ulong uVar5;
  byte *pbVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  char prefix [4];
  
  uVar1 = spec._20_4_;
  uVar7 = (ulong)(uint)value;
  prefix[0] = '\0';
  prefix[1] = '\0';
  prefix[2] = '\0';
  prefix[3] = '\0';
  if (value < 0) {
    prefix[0] = '-';
    prefix[1] = '\0';
    prefix[2] = '\0';
    prefix[3] = '\0';
    uVar7 = (ulong)(uint)-value;
LAB_001dec8d:
    uVar8 = 1;
  }
  else {
    uVar8 = 0;
    if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
      prefix[0] = 0x2b;
      if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
        prefix[0] = 0x20;
      }
      prefix[1] = '\0';
      prefix[2] = '\0';
      prefix[3] = '\0';
      goto LAB_001dec8d;
    }
  }
  code = spec.type_;
  spec._20_4_ = uVar1;
  if (spec.type_ == '\0') {
LAB_001decc7:
    uVar2 = internal::count_digits((uint32_t)uVar7);
    pcVar4 = prepare_int_buffer<fmt::FormatSpec>(this,uVar2,&spec,prefix,uVar8);
    internal::format_decimal<unsigned_int,char>(pcVar4 + (1 - (ulong)uVar2),(uint32_t)uVar7,uVar2);
    return;
  }
  if (spec.type_ == 'B') {
LAB_001ded74:
    uVar2 = uVar8;
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      prefix[uVar8] = '0';
      uVar2 = uVar8 | 2;
      prefix[(ulong)uVar8 + 1] = spec.type_;
    }
    uVar8 = 0;
    uVar5 = uVar7;
    do {
      uVar8 = uVar8 + 1;
      uVar3 = (uint)uVar5;
      uVar5 = uVar5 >> 1;
    } while (1 < uVar3);
    pbVar6 = (byte *)prepare_int_buffer<fmt::FormatSpec>(this,uVar8,&spec,prefix,uVar2);
    do {
      uVar8 = (uint)uVar7;
      *pbVar6 = (byte)uVar7 & 1 | 0x30;
      pbVar6 = pbVar6 + -1;
      uVar7 = uVar7 >> 1;
    } while (1 < uVar8);
  }
  else {
    if (spec.type_ != 'X') {
      if (spec.type_ == 'b') goto LAB_001ded74;
      if (spec.type_ != 'x') {
        if (spec.type_ == 'o') {
          if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
            uVar5 = (ulong)uVar8;
            uVar8 = uVar8 + 1;
            prefix[uVar5] = '0';
          }
          uVar2 = 0;
          uVar5 = uVar7;
          do {
            uVar2 = uVar2 + 1;
            uVar3 = (uint)uVar5;
            uVar5 = uVar5 >> 3;
          } while (7 < uVar3);
          pbVar6 = (byte *)prepare_int_buffer<fmt::FormatSpec>(this,uVar2,&spec,prefix,uVar8);
          do {
            uVar8 = (uint)uVar7;
            *pbVar6 = (byte)uVar7 & 7 | 0x30;
            pbVar6 = pbVar6 + -1;
            uVar7 = uVar7 >> 3;
          } while (7 < uVar8);
          return;
        }
        if (spec.type_ != 'd') {
          pcVar9 = "char";
          if (((undefined1  [24])spec & (undefined1  [24])0x1000000000) == (undefined1  [24])0x0) {
            pcVar9 = "integer";
          }
          internal::report_unknown_type(code,pcVar9);
        }
        goto LAB_001decc7;
      }
    }
    uVar2 = uVar8;
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      prefix[uVar8] = '0';
      uVar2 = uVar8 | 2;
      prefix[(ulong)uVar8 + 1] = spec.type_;
    }
    uVar8 = 0;
    uVar5 = uVar7;
    do {
      uVar8 = uVar8 + 1;
      uVar3 = (uint)uVar5;
      uVar5 = uVar5 >> 4;
    } while (0xf < uVar3);
    pcVar4 = prepare_int_buffer<fmt::FormatSpec>(this,uVar8,&spec,prefix,uVar2);
    pcVar9 = "0123456789ABCDEF";
    if (spec.type_ == 'x') {
      pcVar9 = "0123456789abcdef";
    }
    do {
      uVar8 = (uint)uVar7;
      *pcVar4 = pcVar9[uVar8 & 0xf];
      pcVar4 = pcVar4 + -1;
      uVar7 = uVar7 >> 4;
    } while (0xf < uVar8);
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = value;
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(
      num_digits, spec, prefix, prefix_size) + 1 - num_digits;
    internal::format_decimal(get(p), abs_value, num_digits);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}